

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::coap::Message::Serialize
          (Error *__return_storage_ptr__,Message *this,ByteArray *aBuf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorCode EVar2;
  iterator __position;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar3;
  _Base_ptr p_Var4;
  _List_node_base *p_Var5;
  OptionType OVar6;
  Message *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  long lVar7;
  OptionType aLastOptionNumber;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uriPathSegments;
  allocator_type local_b9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  string *local_b0;
  Message *local_a8;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_a0;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  undefined1 local_80 [24];
  char local_68 [16];
  string local_58;
  _Rb_tree_node_base *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_b0 = (string *)&__return_storage_ptr__->mMessage;
  local_a8 = this;
  local_a0 = (vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf;
  Serialize((Error *)local_80,this,&this->mHeader,aBuf);
  this_00 = (Message *)(local_80 + 8);
  __return_storage_ptr__->mCode = local_80._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)this_00);
  EVar2 = __return_storage_ptr__->mCode;
  if ((char *)local_80._8_8_ != local_68) {
    operator_delete((void *)local_80._8_8_);
  }
  if (EVar2 == kNone) {
    p_Var4 = (local_a8->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38 = &(local_a8->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var4 != local_38) {
      aLastOptionNumber = 0;
      local_b8 = paVar1;
      do {
        OVar6 = (OptionType)p_Var4[1]._M_color;
        if (OVar6 == kUriPath) {
          local_98._M_impl._M_node._M_size = 0;
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          local_98._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
          local_98._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((string *)&local_58,p_Var4[1]._M_parent,p_Var4[1]._M_left);
          SplitUriPath((Error *)local_80,
                       (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_98,&local_58);
          __return_storage_ptr__->mCode = local_80._0_4_;
          this_00 = (Message *)(local_80 + 8);
          std::__cxx11::string::operator=(local_b0,(string *)this_00);
          EVar2 = __return_storage_ptr__->mCode;
          if ((char *)local_80._8_8_ != local_68) {
            operator_delete((void *)local_80._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
          if (EVar2 != kNone) {
LAB_001f8013:
            std::__cxx11::
            _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_clear(&local_98);
            return __return_storage_ptr__;
          }
          OVar6 = aLastOptionNumber;
          if (local_98._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98
             ) {
            OVar6 = (OptionType)p_Var4[1]._M_color;
            p_Var5 = local_98._M_impl._M_node.super__List_node_base._M_next;
            do {
              __first._M_current = (char *)p_Var5[1]._M_next;
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,__first,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__first._M_current + (long)&(p_Var5[1]._M_prev)->_M_next),&local_b9);
              Serialize((Error *)local_80,(Message *)__first._M_current,OVar6,
                        (OptionValue *)&local_58,aLastOptionNumber,(ByteArray *)local_a0);
              __return_storage_ptr__->mCode = local_80._0_4_;
              this_00 = (Message *)(local_80 + 8);
              std::__cxx11::string::operator=(local_b0,(string *)this_00);
              EVar2 = __return_storage_ptr__->mCode;
              if ((char *)local_80._8_8_ != local_68) {
                operator_delete((void *)local_80._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_58._M_dataplus._M_p);
              }
              if (EVar2 != kNone) goto LAB_001f8013;
              OVar6 = (OptionType)p_Var4[1]._M_color;
              p_Var5 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
              aLastOptionNumber = OVar6;
            } while (p_Var5 != (_List_node_base *)&local_98);
          }
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear(&local_98);
        }
        else {
          Serialize((Error *)local_80,this_00,OVar6,(OptionValue *)&p_Var4[1]._M_parent,
                    aLastOptionNumber,(ByteArray *)local_a0);
          __return_storage_ptr__->mCode = local_80._0_4_;
          this_00 = (Message *)(local_80 + 8);
          std::__cxx11::string::operator=(local_b0,(string *)this_00);
          EVar2 = __return_storage_ptr__->mCode;
          if ((char *)local_80._8_8_ != local_68) {
            operator_delete((void *)local_80._8_8_);
          }
          if (EVar2 != kNone) {
            return __return_storage_ptr__;
          }
          OVar6 = (OptionType)p_Var4[1]._M_color;
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        aLastOptionNumber = OVar6;
      } while (p_Var4 != local_38);
    }
    pvVar3 = local_a0;
    if ((local_a8->mPayload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (local_a8->mPayload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      __position._M_current = *(uchar **)(local_a0 + 8);
      if (__position._M_current == *(uchar **)(local_a0 + 0x10)) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>(local_a0,__position,&kPayloadMarker);
        lVar7 = *(long *)(pvVar3 + 8);
      }
      else {
        *__position._M_current = 0xff;
        lVar7 = *(long *)(local_a0 + 8) + 1;
        *(long *)(local_a0 + 8) = lVar7;
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pvVar3,lVar7,
                 (local_a8->mPayload).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (local_a8->mPayload).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Serialize(ByteArray &aBuf) const
{
    Error    error;
    uint16_t lastOptionNumber;

    SuccessOrExit(error = Serialize(mHeader, aBuf));

    lastOptionNumber = 0;
    for (const auto &option : mOptions)
    {
        const auto &number = option.first;
        const auto &value  = option.second;
        if (number == OptionType::kUriPath)
        {
            std::list<std::string> uriPathSegments;
            SuccessOrExit(error = SplitUriPath(uriPathSegments, value.GetStringValue()));
            for (const auto &segment : uriPathSegments)
            {
                SuccessOrExit(error = Serialize(number, OptionValue{segment}, lastOptionNumber, aBuf));
                lastOptionNumber = utils::to_underlying(number);
            }
        }
        else
        {
            SuccessOrExit(error = Serialize(number, value, lastOptionNumber, aBuf));
            lastOptionNumber = utils::to_underlying(number);
        }
    }

    if (!mPayload.empty())
    {
        aBuf.push_back(kPayloadMarker);
        aBuf.insert(aBuf.end(), mPayload.begin(), mPayload.end());
    }

exit:
    return error;
}